

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O2

bool __thiscall
json::SaveObject::process<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (SaveObject *this,char *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *t)

{
  ostream *poVar1;
  int i;
  int iVar2;
  
  if (this->first == true) {
    this->first = false;
  }
  else {
    std::operator<<(this->out,",\n");
  }
  for (iVar2 = 0; iVar2 < this->tabs; iVar2 = iVar2 + 1) {
    std::operator<<(this->out,'\t');
  }
  poVar1 = std::operator<<(this->out,'\"');
  poVar1 = std::operator<<(poVar1,name);
  poVar1 = std::operator<<(poVar1,'\"');
  std::operator<<(poVar1,": ");
  save<std::__cxx11::string,std::allocator<std::__cxx11::string>>(this->out,t,this->tabs);
  return ((byte)this->out[*(long *)(*(long *)this->out + -0x18) + 0x20] & 5) == 0;
}

Assistant:

bool process(const char* name, T& t) {
		if (first)
			first = false;
		else
			out << ",\n";
		for (int i = 0; i < tabs; ++i) out << '\t';
		out << quote << name << quote << ": ";
		save(out, t, tabs);
		if (out.fail())
			return false;
		return true;
	}